

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::PeerManagerImpl
          (PeerManagerImpl *this,CConnman *connman,AddrMan *addrman,BanMan *banman,
          ChainstateManager *chainman,CTxMemPool *pool,Warnings *warnings,Options opts)

{
  long lVar1;
  duration<long,_std::ratio<1L,_1L>_> __i;
  duration<long,_std::ratio<1L,_1000000L>_> __i_00;
  duration<long,_std::ratio<1L,_1L>_> __i_01;
  duration<long,_std::ratio<1L,_1L>_> __i_02;
  CChainParams *pCVar2;
  seconds sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  undefined1 in_stack_00000010;
  byte in_stack_00000011;
  undefined6 in_stack_00000012;
  undefined8 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  CFeeRate *in_stack_fffffffffffffe60;
  unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *puVar4;
  FastRandomContext *in_stack_fffffffffffffe68;
  unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *this_00;
  Warnings *in_stack_fffffffffffffe80;
  uint *__args;
  TimeOffsets *in_stack_fffffffffffffe88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PeerManager::PeerManager
            ((PeerManager *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  *in_RDI = &PTR_UpdatedBlockTip_0160f350;
  in_RDI[1] = &PTR_InitializeNode_0160f448;
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffe68,SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  CFeeRate::CFeeRate<unsigned_int>
            ((CFeeRate *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  FeeFilterRounder::FeeFilterRounder
            ((FeeFilterRounder *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             (FastRandomContext *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  pCVar2 = ChainstateManager::GetParams
                     ((ChainstateManager *)
                      CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  in_RDI[0x1f] = pCVar2;
  in_RDI[0x20] = in_RSI;
  in_RDI[0x21] = in_RDX;
  in_RDI[0x22] = in_RCX;
  in_RDI[0x23] = in_R8;
  in_RDI[0x24] = in_R9;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  TxRequestTracker::TxRequestTracker((TxRequestTracker *)0x297614,(bool)in_stack_fffffffffffffe5f);
  std::unique_ptr<TxReconciliationTracker,std::default_delete<TxReconciliationTracker>>::
  unique_ptr<std::default_delete<TxReconciliationTracker>,void>
            ((unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  s<(char)48>();
  __i.__r._7_1_ = in_stack_fffffffffffffe5f;
  __i.__r._0_7_ = in_stack_fffffffffffffe58;
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::atomic
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)0x297695,__i);
  sVar3 = s<(char)48>();
  in_RDI[0x2e] = sVar3.__r;
  in_RDI[0x2f] = in_stack_00000008;
  TimeOffsets::TimeOffsets(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  *(undefined4 *)(in_RDI + 0x42) = in_stack_00000020;
  in_RDI[0x40] = CONCAT62(in_stack_00000012,CONCAT11(in_stack_00000011,in_stack_00000010));
  in_RDI[0x41] = in_stack_00000018;
  *(undefined1 *)((long)in_RDI + 0x214) = 0;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  ::map((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::
  map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
  ::map((map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
         *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  us<(char)48>();
  __i_00.__r._7_1_ = in_stack_fffffffffffffe5f;
  __i_00.__r._0_7_ = in_stack_fffffffffffffe58;
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::atomic
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)0x2977c4,__i_00);
  *(undefined4 *)(in_RDI + 0x55) = 0;
  *(undefined8 *)((long)in_RDI + 700) = 0;
  *(undefined8 *)((long)in_RDI + 0x2c4) = 0;
  *(undefined8 *)((long)in_RDI + 0x2ac) = 0;
  *(undefined8 *)((long)in_RDI + 0x2b4) = 0;
  uint256::uint256((uint256 *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::
  map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  ::map((map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),0);
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  __i_01.__r._7_1_ = in_stack_fffffffffffffe5f;
  __i_01.__r._0_7_ = in_stack_fffffffffffffe58;
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::atomic
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)0x297867,__i_01);
  std::unique_ptr<CRollingBloomFilter,std::default_delete<CRollingBloomFilter>>::
  unique_ptr<std::default_delete<CRollingBloomFilter>,void>
            ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),(nullptr_t)0x29788b);
  std::unique_ptr<CRollingBloomFilter,std::default_delete<CRollingBloomFilter>>::
  unique_ptr<std::default_delete<CRollingBloomFilter>,void>
            ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),(nullptr_t)0x2978a9);
  std::unique_ptr<CRollingBloomFilter,std::default_delete<CRollingBloomFilter>>::
  unique_ptr<std::default_delete<CRollingBloomFilter>,void>
            ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),(nullptr_t)0x2978c7);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::shared_ptr<const_CBlock>::shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::shared_ptr<const_CBlockHeaderAndShortTxIDs>::shared_ptr
            ((shared_ptr<const_CBlockHeaderAndShortTxIDs> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  uint256::uint256((uint256 *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  std::
  unique_ptr<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>const,std::default_delete<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>const>>
  ::
  unique_ptr<std::default_delete<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>const>,void>
            ((unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  __args = (uint *)(in_RDI + 0x74);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  in_RDI[0x7d] = 0;
  in_RDI[0x7e] = 0;
  in_RDI[0x7b] = 0;
  in_RDI[0x7c] = 0;
  in_RDI[0x79] = 0;
  in_RDI[0x7a] = 0;
  std::
  map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  ::map((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  in_RDI[0x7f] = 0xffffffffffffffff;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),false);
  *(undefined4 *)((long)in_RDI + 0x404) = 0;
  std::
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  ::multimap((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  sVar3 = s<(char)48>();
  __i_02.__r._7_1_ = in_stack_fffffffffffffe5f;
  __i_02.__r._0_7_ = in_stack_fffffffffffffe58;
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::atomic
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)0x297a19,__i_02);
  this_00 = (unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *)
            (in_RDI + 0x88);
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  *(undefined4 *)(in_RDI + 0x8b) = 0;
  TxOrphanage::TxOrphanage((TxOrphanage *)sVar3.__r);
  puVar4 = (unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *)
           (in_RDI + 0xa2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  in_RDI[0xa5] = 0;
  if ((in_stack_00000011 & 1) != 0) {
    std::make_unique<TxReconciliationTracker,unsigned_int_const&>(__args);
    std::unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>::
    operator=(this_00,puVar4);
    std::unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>::
    ~unique_ptr(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PeerManagerImpl::PeerManagerImpl(CConnman& connman, AddrMan& addrman,
                                 BanMan* banman, ChainstateManager& chainman,
                                 CTxMemPool& pool, node::Warnings& warnings, Options opts)
    : m_rng{opts.deterministic_rng},
      m_fee_filter_rounder{CFeeRate{DEFAULT_MIN_RELAY_TX_FEE}, m_rng},
      m_chainparams(chainman.GetParams()),
      m_connman(connman),
      m_addrman(addrman),
      m_banman(banman),
      m_chainman(chainman),
      m_mempool(pool),
      m_warnings{warnings},
      m_opts{opts}
{
    // While Erlay support is incomplete, it must be enabled explicitly via -txreconciliation.
    // This argument can go away after Erlay support is complete.
    if (opts.reconcile_txs) {
        m_txreconciliation = std::make_unique<TxReconciliationTracker>(TXRECONCILIATION_VERSION);
    }
}